

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::IfcRailing(IfcRailing *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_008ee2a0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcRailing";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__009377a8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x937678;
  *(undefined8 *)&this->field_0x180 = 0x937790;
  *(undefined8 *)&this->field_0x88 = 0x9376a0;
  *(undefined8 *)&this->field_0x98 = 0x9376c8;
  *(undefined8 *)&this->field_0xd0 = 0x9376f0;
  *(undefined8 *)&this->field_0x100 = 0x937718;
  *(undefined8 *)&this->field_0x138 = 0x937740;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x937768;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}